

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz.h
# Opt level: O3

ZZ<130UL> * __thiscall GF2::ZZ<130UL>::operator%=(ZZ<130UL> *this,word wRight)

{
  word wVar1;
  word wVar2;
  size_t pos;
  long lVar3;
  bool bVar4;
  
  lVar3 = 2;
  wVar2 = 0;
  do {
    wVar1 = (this->super_WW<130UL>)._words[lVar3];
    wVar2 = __udivti3(wVar1,wVar2,wRight,0);
    (this->super_WW<130UL>)._words[lVar3] = wVar2;
    wVar2 = wVar1 - wVar2 * wRight;
    bVar4 = lVar3 != 0;
    lVar3 = lVar3 + -1;
  } while (bVar4);
  (this->super_WW<130UL>)._words[0] = wVar2;
  (this->super_WW<130UL>)._words[1] = 0;
  (this->super_WW<130UL>)._words[2] = 0;
  return this;
}

Assistant:

ZZ& operator%=(word wRight)
	{	
		Div(wRight);
		return operator=(wRight);
	}